

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O0

void print(char *msg)

{
  LogLevel LVar1;
  LogStream *this;
  self *psVar2;
  SourceFile file;
  int64_t local_1028;
  Timestamp local_1020 [6];
  undefined1 local_ff0 [12];
  Logger local_fe0;
  char *local_10;
  char *msg_local;
  
  local_10 = msg;
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_ff0,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    sznet::Logger::Logger(&local_fe0,file,0x1d);
    this = sznet::Logger::stream(&local_fe0);
    psVar2 = sznet::LogStream::operator<<(this,"time:");
    local_1028 = (int64_t)sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(local_1020,SUB81(&local_1028,0));
    psVar2 = sznet::LogStream::operator<<(psVar2,(string *)local_1020);
    psVar2 = sznet::LogStream::operator<<(psVar2," msg:");
    sznet::LogStream::operator<<(psVar2,local_10);
    std::__cxx11::string::~string((string *)local_1020);
    sznet::Logger::~Logger(&local_fe0);
  }
  cnt = cnt + 1;
  if (cnt == 0x14) {
    sznet::net::EventLoop::quit(g_timequeue_loop);
  }
  return;
}

Assistant:

void print(const char* msg)
{
	LOG_INFO << "time:" << Timestamp::now().toFormattedString() << " msg:" << msg;
	if (++cnt == 20)
	{
		g_timequeue_loop->quit();
	}
}